

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O0

void NHandyPack::
     TVectorSerializer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
     ::Dump(ostream *out,
           basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *object)

{
  bool bVar1;
  reference t;
  wchar_t *obj;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__range2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbStack_18;
  uint32_t size;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *object_local;
  ostream *out_local;
  
  pbStack_18 = object;
  object_local = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)out;
  __range2._4_4_ = std::__cxx11::wstring::size();
  std::ostream::write((char *)object_local,(long)&__range2 + 4);
  __end0._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  obj = (wchar_t *)std::__cxx11::wstring::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                                *)&obj);
    if (!bVar1) break;
    t = __gnu_cxx::
        __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::operator*(&__end0);
    Dump<wchar_t>((ostream *)object_local,t);
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

static inline void Dump(std::ostream& out, const TVec& object) {
        uint32_t size = object.size();
        out.write((const char*)(&size), sizeof(size));
        for (const auto& obj: object) {
            NHandyPack::Dump(out, obj);
        }
    }